

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

int skip_blank(char **pp,char *end)

{
  byte bVar1;
  int in_EAX;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar3 = (byte *)*pp;
  do {
    if (pbVar3 == (byte *)end) {
LAB_00164001:
      *pp = end;
      return 0x101;
    }
    bVar1 = *pbVar3;
    if (bVar1 < 0x2f) {
      bVar4 = false;
      if ((bVar1 != 9) && (bVar1 != 0x20)) {
LAB_00163f8f:
        bVar4 = bVar1 == 0xd || bVar1 == 10;
        if (((bVar1 == 0xd) || (bVar1 == 10)) && ((pbVar3 + 1 != (byte *)end && (pbVar3[1] == 10))))
        {
          pbVar3 = pbVar3 + 1;
        }
LAB_00163fc6:
        in_EAX = (int)(char)bVar1;
        *pp = (char *)pbVar3;
        if (bVar4) {
          in_EAX = 0x100;
        }
        bVar4 = true;
      }
    }
    else {
      if (bVar1 != 0x3b) {
        if (bVar1 != 0x2f) goto LAB_00163f8f;
        if ((pbVar3 + 1 == (byte *)end) || (pbVar3[1] != 0x2f)) {
          bVar4 = false;
          goto LAB_00163fc6;
        }
      }
      pbVar2 = pbVar3 + 1;
      do {
        pbVar3 = pbVar2;
        if (pbVar3 == (byte *)end) {
          bVar4 = false;
          pbVar3 = (byte *)end;
          goto LAB_00163fde;
        }
        pbVar2 = pbVar3 + 1;
      } while ((*pbVar3 != 0xd) && (*pbVar3 != 10));
      if ((pbVar2 != (byte *)end) && (*pbVar2 == 10)) {
        pbVar3 = pbVar2;
      }
      *pp = (char *)pbVar3;
      bVar4 = true;
      in_EAX = 0x100;
    }
LAB_00163fde:
    if ((bVar1 != 0x20) && (bVar1 != 9)) {
      if (bVar4) {
        return in_EAX;
      }
      goto LAB_00164001;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

static int skip_blank(const char** pp, const char* end)
{
	for (const char* p = *pp; p != end; ++p) {
		int c = *p;
		if (c == ' ' || c == '\t') {
			// skip whitespace
			continue;
		}
		if (c == ';' || (c == '/' && (p + 1) != end && *(p + 1) == '/')) {
			// skip comment
			for (++p;; ++p) {
				if (p == end)
					goto eof_reached;
				c = *p;
				if (is_eol(c)) {
					if ((p + 1) != end && *(p + 1) == '\n')
						p++;
					*pp = p;
					return IF_EOL;
				}
			}
		}
		if (is_eol(c) && (p + 1) != end && *(p + 1) == '\n')
			p++;
		*pp = p;
		return is_eol(c)? IF_EOL : c;
	}
eof_reached:
	*pp = end;
	return IF_EOF;
}